

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

CustomLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::CustomLayerParams>
          (Arena *arena)

{
  CustomLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomLayerParams *)operator_new(0x70);
    CoreML::Specification::CustomLayerParams::CustomLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (CustomLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x70,(type_info *)&CoreML::Specification::CustomLayerParams::typeinfo);
    CoreML::Specification::CustomLayerParams::CustomLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }